

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackTrace.cpp
# Opt level: O2

bool idx2::PrintStacktrace(printer *Pr)

{
  char cVar1;
  FILE *__stream;
  uint __line;
  int iVar2;
  int iVar3;
  int iVar4;
  void *__ptr;
  char *pcVar5;
  FILE *pFVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcVar9;
  char *pcVar10;
  char *pcVar11;
  char *pcVar12;
  long lVar13;
  int Status;
  long local_ac8;
  size_t FuncNameSize;
  void *AddrList [64];
  char Buffer [128];
  char Buffer_1 [1024];
  char Syscom [1024];
  
  pFVar6 = (FILE *)Pr->File;
  if (Pr->Buf == (char *)0x0) {
    if (pFVar6 != (FILE *)0x0) {
      fwrite("Stack trace:\n",0xd,1,pFVar6);
LAB_00168ef6:
      iVar2 = backtrace(AddrList,0x40);
      if (iVar2 != 0) {
        __ptr = (void *)backtrace_symbols(AddrList,iVar2);
        FuncNameSize = 0x80;
        local_ac8 = (long)iVar2;
        pcVar8 = Buffer;
        for (lVar13 = 1; lVar13 < local_ac8; lVar13 = lVar13 + 1) {
          pcVar7 = *(char **)((long)__ptr + lVar13 * 8);
          pcVar5 = pcVar7;
          pcVar10 = (char *)0x0;
          pcVar12 = (char *)0x0;
LAB_00168f67:
          cVar1 = *pcVar5;
          pcVar9 = pcVar5;
          pcVar11 = pcVar12;
          if ((cVar1 == '(') || (pcVar9 = pcVar10, pcVar11 = pcVar5, cVar1 == '+')) {
LAB_00168f94:
            pcVar5 = pcVar5 + 1;
            pcVar10 = pcVar9;
            pcVar12 = pcVar11;
            goto LAB_00168f67;
          }
          if (cVar1 != '\0') {
            pcVar11 = pcVar12;
            if (cVar1 == ')' && pcVar12 != (char *)0x0) goto LAB_00168f9b;
            goto LAB_00168f94;
          }
          pcVar5 = (char *)0x0;
LAB_00168f9b:
          if (pcVar10 < pcVar12 &&
              (pcVar5 != (char *)0x0 && (pcVar12 != (char *)0x0 && pcVar10 != (char *)0x0))) {
            *pcVar10 = '\0';
            pcVar10 = pcVar10 + 1;
            *pcVar12 = '\0';
            pcVar12 = pcVar12 + 1;
            *pcVar5 = '\0';
            pcVar5 = (char *)__cxa_demangle(pcVar10,pcVar8,&FuncNameSize,&Status);
            pcVar7 = Pr->Buf;
            pFVar6 = (FILE *)Pr->File;
            if (Status == 0) {
              if (pcVar7 == (char *)0x0) {
                if (pFVar6 == (FILE *)0x0) goto LAB_001693c7;
                fprintf(pFVar6,"  %s: %s +%s [%p]\n",*(undefined8 *)((long)__ptr + lVar13 * 8),
                        pcVar5,pcVar12,AddrList[lVar13]);
              }
              else {
                if (pFVar6 != (FILE *)0x0) {
LAB_001693c7:
                  pcVar8 = "false && \"unavailable or ambiguous printer destination\"";
LAB_001693e0:
                  __assert_fail(pcVar8,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/StackTrace.cpp"
                                ,0x9a,"bool idx2::PrintStacktrace(printer *)");
                }
                if ((long)Pr->Size < 2) {
                  pcVar8 = "false && \"buffer too small\"";
                  goto LAB_001693e0;
                }
                iVar3 = snprintf(pcVar7,(long)Pr->Size,"  %s: %s +%s [%p]\n",
                                 *(undefined8 *)((long)__ptr + lVar13 * 8),pcVar5,pcVar12,
                                 AddrList[lVar13]);
                Pr->Buf = Pr->Buf + iVar3;
                iVar4 = Pr->Size - iVar3;
                if (iVar4 == 0 || Pr->Size < iVar3) {
                  pcVar8 = "false && \"buffer overflow?\"";
                  goto LAB_001693e0;
                }
                Pr->Size = iVar4;
              }
            }
            else {
              pcVar5 = pcVar8;
              if (pcVar7 == (char *)0x0) {
                if (pFVar6 == (FILE *)0x0) goto LAB_00169377;
                fprintf(pFVar6,"  %s: %s() +%s [%p]\n",*(undefined8 *)((long)__ptr + lVar13 * 8),
                        pcVar10,pcVar12,AddrList[lVar13]);
              }
              else {
                if (pFVar6 != (FILE *)0x0) {
LAB_00169377:
                  pcVar8 = "false && \"unavailable or ambiguous printer destination\"";
LAB_001693af:
                  __assert_fail(pcVar8,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/StackTrace.cpp"
                                ,0x9e,"bool idx2::PrintStacktrace(printer *)");
                }
                if ((long)Pr->Size < 2) {
                  pcVar8 = "false && \"buffer too small\"";
                  goto LAB_001693af;
                }
                iVar3 = snprintf(pcVar7,(long)Pr->Size,"  %s: %s() +%s [%p]\n",
                                 *(undefined8 *)((long)__ptr + lVar13 * 8),pcVar10,pcVar12,
                                 AddrList[lVar13]);
                Pr->Buf = Pr->Buf + iVar3;
                iVar4 = Pr->Size - iVar3;
                if (iVar4 == 0 || Pr->Size < iVar3) {
                  pcVar8 = "false && \"buffer overflow?\"";
                  goto LAB_001693af;
                }
                Pr->Size = iVar4;
              }
            }
            snprintf(Syscom,0x400,"addr2line %p -e %s",AddrList[lVar13],"main");
            pFVar6 = popen(Syscom,"r");
            pcVar8 = pcVar5;
            if (pFVar6 != (FILE *)0x0) {
              memset(Buffer_1,0,0x400);
              while (pcVar7 = fgets(Buffer_1,0x400,pFVar6), pcVar7 != (char *)0x0) {
                __stream = (FILE *)Pr->File;
                if (Pr->Buf == (char *)0x0) {
                  if (__stream == (FILE *)0x0) {
LAB_00169334:
                    pcVar8 = "false && \"unavailable or ambiguous printer destination\"";
LAB_0016934d:
                    __assert_fail(pcVar8,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/StackTrace.cpp"
                                  ,0xaa,"bool idx2::PrintStacktrace(printer *)");
                  }
                  fprintf(__stream,"    %s",Buffer_1);
                }
                else {
                  if (__stream != (FILE *)0x0) goto LAB_00169334;
                  if ((long)Pr->Size < 2) {
                    pcVar8 = "false && \"buffer too small\"";
                    goto LAB_0016934d;
                  }
                  iVar3 = snprintf(Pr->Buf,(long)Pr->Size,"    %s",Buffer_1);
                  Pr->Buf = Pr->Buf + iVar3;
                  iVar4 = Pr->Size - iVar3;
                  if (iVar4 == 0 || Pr->Size < iVar3) {
                    pcVar8 = "false && \"buffer overflow?\"";
                    goto LAB_0016934d;
                  }
                  Pr->Size = iVar4;
                }
              }
              pclose(pFVar6);
            }
          }
          else {
            pFVar6 = (FILE *)Pr->File;
            if (Pr->Buf == (char *)0x0) {
              if (pFVar6 == (FILE *)0x0) goto LAB_00169365;
              fprintf(pFVar6,"  %s\n",pcVar7);
            }
            else {
              if (pFVar6 != (FILE *)0x0) {
LAB_00169365:
                pcVar8 = "false && \"unavailable or ambiguous printer destination\"";
LAB_00169387:
                __assert_fail(pcVar8,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/StackTrace.cpp"
                              ,0xb0,"bool idx2::PrintStacktrace(printer *)");
              }
              if ((long)Pr->Size < 2) {
                pcVar8 = "false && \"buffer too small\"";
                goto LAB_00169387;
              }
              iVar3 = snprintf(Pr->Buf,(long)Pr->Size,"  %s\n");
              Pr->Buf = Pr->Buf + iVar3;
              iVar4 = Pr->Size - iVar3;
              if (iVar4 == 0 || Pr->Size < iVar3) {
                pcVar8 = "false && \"buffer overflow?\"";
                goto LAB_00169387;
              }
              Pr->Size = iVar4;
            }
          }
        }
        free(__ptr);
LAB_0016931d:
        return iVar2 != 0;
      }
      pFVar6 = (FILE *)Pr->File;
      if (Pr->Buf == (char *)0x0) {
        if (pFVar6 != (FILE *)0x0) {
          fwrite("  <empty, possibly corrupt>\n",0x1c,1,pFVar6);
          goto LAB_0016931d;
        }
LAB_00169423:
        pcVar8 = "false && \"unavailable or ambiguous printer destination\"";
      }
      else {
        if (pFVar6 != (FILE *)0x0) goto LAB_00169423;
        if ((long)Pr->Size < 2) {
          pcVar8 = "false && \"buffer too small\"";
        }
        else {
          iVar3 = snprintf(Pr->Buf,(long)Pr->Size,"  <empty, possibly corrupt>\n");
          Pr->Buf = Pr->Buf + iVar3;
          iVar4 = Pr->Size - iVar3;
          if (iVar4 != 0 && iVar3 <= Pr->Size) {
            Pr->Size = iVar4;
            goto LAB_0016931d;
          }
          pcVar8 = "false && \"buffer overflow?\"";
        }
      }
      __line = 0x73;
      goto LAB_0016944c;
    }
LAB_001693f8:
    pcVar8 = "false && \"unavailable or ambiguous printer destination\"";
  }
  else {
    if (pFVar6 != (FILE *)0x0) goto LAB_001693f8;
    if ((long)Pr->Size < 2) {
      pcVar8 = "false && \"buffer too small\"";
    }
    else {
      iVar2 = snprintf(Pr->Buf,(long)Pr->Size,"Stack trace:\n");
      Pr->Buf = Pr->Buf + iVar2;
      iVar3 = Pr->Size - iVar2;
      if (iVar3 != 0 && iVar2 <= Pr->Size) {
        Pr->Size = iVar3;
        goto LAB_00168ef6;
      }
      pcVar8 = "false && \"buffer overflow?\"";
    }
  }
  __line = 0x6c;
LAB_0016944c:
  __assert_fail(pcVar8,
                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/StackTrace.cpp"
                ,__line,"bool idx2::PrintStacktrace(printer *)");
}

Assistant:

bool
PrintStacktrace(printer* Pr)
{
  idx2_Print(Pr, "Stack trace:\n");
  constexpr int MaxFrames = 63;
  void* AddrList[MaxFrames + 1]; // Storage array for stack trace address data
  /* Retrieve current stack addresses */
  int AddrLen = backtrace(AddrList, sizeof(AddrList) / sizeof(void*));
  if (AddrLen == 0)
  {
    idx2_Print(Pr, "  <empty, possibly corrupt>\n");
    return false;
  }
  /* Resolve addresses into strings containing "filename(function+address)", */
  char** SymbolList = backtrace_symbols(AddrList, AddrLen);
  size_t FuncNameSize = 128;
  char Buffer[128];
  char* FuncName = Buffer;
  // iterate over the returned symbol lines (skip the first)
  for (int I = 1; I < AddrLen; ++I)
  {
    // fprintf(stderr, "%s\n", SymbolList[I]);
    char *BeginName = 0, *BeginOffset = 0, *EndOffset = 0;
    /* Find parentheses and +address offset surrounding the mangled name:
    e.g., ./module(function+0x15c) [0x8048a6d] */
    for (char* P = SymbolList[I]; *P; ++P)
    {
      if (*P == '(')
        BeginName = P;
      else if (*P == '+')
        BeginOffset = P;
      else if (*P == ')' && BeginOffset)
      {
        EndOffset = P;
        break;
      }
    }
    if (BeginName && BeginOffset && EndOffset && BeginName < BeginOffset)
    {
      *BeginName++ = '\0';
      *BeginOffset++ = '\0';
      *EndOffset = '\0';
      /* mangled name is now in [BeginName, BeginOffset) and caller offset in
[BeginOffset, EndOffset) */
      int Status;
      char* Ret = abi::__cxa_demangle(BeginName, FuncName, &FuncNameSize, &Status);
      if (Status == 0)
      {
        FuncName = Ret; // use possibly realloc()-ed string
        idx2_Print(Pr, "  %s: %s +%s [%p]\n", SymbolList[I], FuncName, BeginOffset, AddrList[I]);
      }
      else
      { // demangling failed
        idx2_Print(Pr, "  %s: %s() +%s [%p]\n", SymbolList[I], BeginName, BeginOffset, AddrList[I]);
      }
      /* get file names and line numbers using addr2line */
      constexpr int BufLen = 1024;
      char Syscom[BufLen];
      // last parameter is the name of this app
      snprintf(Syscom, BufLen, "addr2line %p -e %s", AddrList[I], "main");
      FILE* F = popen(Syscom, "r");
      if (F)
      {
        char Buffer[BufLen] = { 0 };
        while (fgets(Buffer, sizeof(Buffer), F))
          idx2_Print(Pr, "    %s", Buffer);
        pclose(F);
      }
    }
    else
    { // couldn't parse the line? print the whole line.
      idx2_Print(Pr, "  %s\n", SymbolList[I]);
    }
  }
  free(SymbolList);
  return true;
}